

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O0

bool __thiscall WrapperTable::Verify(WrapperTable *this,Verifier *verifier)

{
  bool bVar1;
  Vector<signed_char,_unsigned_int> *vec;
  undefined1 local_19;
  Verifier *verifier_local;
  WrapperTable *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyOffset64(&this->super_Table,verifier,4);
    local_19 = false;
    if (bVar1) {
      vec = vector(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<signed_char,_unsigned_int>
                        (verifier,vec);
      local_19 = false;
      if (bVar1) {
        local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset64(verifier, VT_VECTOR) &&
           verifier.VerifyVector(vector()) &&
           verifier.EndTable();
  }